

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O3

void design_artifact(artifact_set_data *data,wchar_t tv,int *aidx)

{
  bitflag *flags1;
  _Bool **dest;
  element_info *peVar1;
  element_info *peVar2;
  element_info *peVar3;
  element_info *peVar4;
  element_info *peVar5;
  element_info *peVar6;
  element_info *peVar7;
  element_info *peVar8;
  element_info *peVar9;
  element_info *peVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  slay_conflict *psVar14;
  brand_conflict *pbVar15;
  _Bool _Var16;
  int16_t iVar17;
  uint32_t uVar18;
  wchar_t wVar19;
  int iVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  object_kind *poVar23;
  artifact *a_dst;
  char *pcVar24;
  char *pcVar25;
  long lVar26;
  int *piVar27;
  ulong uVar28;
  object_kind *poVar29;
  wchar_t *pwVar30;
  element_info *peVar31;
  _Bool verbose;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar32;
  _Bool verbose_00;
  wchar_t wVar33;
  wchar_t extraout_EDX;
  wchar_t wVar34;
  artifact *paVar35;
  long lVar36;
  undefined8 uVar37;
  uint uVar38;
  int iVar39;
  ulong uVar40;
  int16_t *piVar41;
  artifact *a;
  bool bVar42;
  wchar_t wVar43;
  uint uVar44;
  projection_conflict *ppVar45;
  byte bVar46;
  long lVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  random_value v;
  uint local_3d4;
  wchar_t local_3ac;
  wchar_t local_338;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  wchar_t art_freq [94];
  
  paVar35 = a_info;
  bVar46 = 0;
  iVar39 = *aidx;
  poVar23 = lookup_kind(a_info[iVar39].tval,a_info[iVar39].sval);
  local_3ac = paVar35[iVar39].level;
  if (tv == L'\0') {
    uVar18 = Rand_div(data->tv_freq[0x23]);
    tv = L'\xffffffff';
    piVar27 = data->tv_freq;
    do {
      tv = tv + L'\x01';
      iVar20 = *piVar27;
      piVar27 = piVar27 + 1;
    } while (iVar20 <= (int)uVar18);
  }
  paVar35 = paVar35 + iVar39;
  a_dst = (artifact *)mem_zalloc(0x140);
  a = (artifact *)(ulong)(uint)data->avg_tv_power[tv];
  wVar19 = Rand_sample(data->avg_tv_power[tv],data->max_tv_power[tv],data->min_tv_power[tv],0x14,
                       0x14);
  pcVar24 = artifact_gen_name(a,name_sections);
  while ((pcVar25 = strstr(paVar35->name,"The One Ring"), pcVar25 != (char *)0x0 ||
         (_Var16 = flag_has_dbg(poVar23->kind_flags,2,5,"kind->kind_flags","KF_QUEST_ART"), _Var16))
        ) {
    lVar26 = (long)*aidx + 1;
    *aidx = (int)lVar26;
    if ((int)(uint)z_info->a_max <= (int)lVar26) {
      string_free(pcVar24);
      mem_free(a_dst);
      return;
    }
    paVar35 = a_info + lVar26;
    local_3ac = a_info[lVar26].level;
  }
  string_free(paVar35->name);
  paVar35->name = pcVar24;
  file_putf(log_file,">>>>>>>>>>>>>>>>>>>>>>>>>> CREATING NEW ARTIFACT\n");
  file_putf(log_file,"Artifact %d: power = %d\n",(ulong)(uint)*aidx,wVar19);
  wVar34 = -wVar19;
  if (L'\0' < wVar19) {
    wVar34 = wVar19;
  }
  flags1 = paVar35->flags;
  dest = &paVar35->brands;
  wVar33 = (uint)(wVar34 * 6) / 10 + L'\x01';
  if (wVar33 <= wVar34 + L'\xffffffec') {
    wVar33 = wVar34 + L'\xffffffec';
  }
  peVar1 = paVar35->el_info;
  iVar39 = 0;
  do {
    if (tv == L'\0') {
      uVar18 = Rand_div(data->tv_freq[0x23]);
      tv = L'\xffffffff';
      piVar27 = data->tv_freq;
      do {
        tv = tv + L'\x01';
        iVar20 = *piVar27;
        piVar27 = piVar27 + 1;
      } while (iVar20 <= (int)uVar18);
    }
    local_2c8 = (undefined1  [16])0x0;
    local_2d8 = (undefined1  [16])0x0;
    local_2e8 = (undefined1  [16])0x0;
    local_2f8 = (undefined1  [16])0x0;
    local_308 = (undefined1  [16])0x0;
    local_318 = (undefined1  [16])0x0;
    local_328 = (undefined1  [16])0x0;
    local_2b8 = 0;
    wVar43 = L'\x01';
    if ((tv & 0xfffffffeU) == 0x14) {
      wVar43 = L'\x01';
      poVar23 = lookup_kind(tv,L'\x01');
      if (poVar23->kidx < (uint)z_info->ordinary_kind_max) {
        wVar43 = L'\x01';
        do {
          wVar43 = wVar43 + L'\x01';
          poVar23 = lookup_kind(tv,wVar43);
        } while (poVar23->kidx < (uint)z_info->ordinary_kind_max);
      }
    }
    do {
      do {
        uVar18 = Rand_div((kb_info[tv].num_svals - wVar43) + 1);
        poVar23 = lookup_kind(tv,uVar18 + wVar43);
        pcVar24 = strstr(poVar23->name,"Ring of");
      } while (pcVar24 != (char *)0x0);
      _Var16 = flag_has_dbg(poVar23->kind_flags,2,5,"kind->kind_flags","KF_QUEST_ART");
    } while (_Var16);
    object_short_name(local_328,0x78,poVar23->name);
    file_putf(log_file,"Creating %s\n",local_328);
    iVar20 = poVar23->sval;
    paVar35->tval = poVar23->tval;
    paVar35->sval = iVar20;
    wVar43 = randcalc(poVar23->to_h,0,MINIMISE);
    paVar35->to_h = wVar43;
    wVar43 = randcalc(poVar23->to_d,0,MINIMISE);
    paVar35->to_d = wVar43;
    wVar43 = randcalc(poVar23->to_a,0,MINIMISE);
    paVar35->to_a = wVar43;
    iVar20 = poVar23->dd;
    iVar12 = poVar23->ds;
    iVar13 = poVar23->weight;
    paVar35->ac = poVar23->ac;
    paVar35->dd = iVar20;
    paVar35->ds = iVar12;
    paVar35->weight = iVar13;
    flag_copy(flags1,poVar23->flags,5);
    mem_free(paVar35->slays);
    paVar35->slays = (_Bool *)0x0;
    copy_slays(&paVar35->slays,poVar23->slays);
    mem_free(paVar35->brands);
    paVar35->brands = (_Bool *)0x0;
    copy_brands(dest,poVar23->brands);
    mem_free(paVar35->curses);
    paVar35->curses = (int *)0x0;
    if (poVar23->curses != (int *)0x0) {
      piVar27 = (int *)mem_alloc((ulong)z_info->curse_max << 2);
      paVar35->curses = piVar27;
      memcpy(piVar27,poVar23->curses,(ulong)z_info->curse_max << 2);
    }
    paVar35->activation = (activation *)0x0;
    string_free(paVar35->alt_msg);
    paVar35->alt_msg = (char *)0x0;
    if (poVar23->activation == (activation *)0x0) {
      if (poVar23->effect == (effect *)0x0) {
        wVar43 = L'\0';
      }
      else {
        wVar43 = poVar23->level;
      }
    }
    else {
      wVar43 = poVar23->activation->level;
    }
    paVar35->level = wVar43;
    (paVar35->time).base = 0;
    (paVar35->time).dice = 0;
    (paVar35->time).sides = 0;
    (paVar35->time).m_bonus = 0;
    lVar26 = 0;
    do {
      v._8_8_ = *(undefined8 *)(&poVar23->modifiers[0].sides + lVar26);
      v._0_8_ = *(undefined8 *)(&poVar23->modifiers[0].base + lVar26);
      iVar20 = randcalc(v,0,MINIMISE);
      *(int *)((long)paVar35->modifiers + lVar26) = iVar20;
      lVar26 = lVar26 + 4;
    } while (lVar26 != 0x40);
    lVar26 = 0;
    do {
      paVar35->el_info[lVar26] = poVar23->el_info[lVar26];
      lVar26 = lVar26 + 1;
    } while (lVar26 != 0x19);
    lVar26 = 0x92;
    do {
      paVar35->flags[lVar26 + -0x48] = paVar35->flags[lVar26 + -0x48] | 2;
      lVar26 = lVar26 + 4;
    } while (lVar26 != 0xa2);
    iVar20 = poVar23->tval;
    if (iVar20 - 10U < 9) {
      uVar18 = data->ac_startval;
      uVar21 = Rand_div(uVar18);
      paVar35->to_a =
           (int)(short)((short)uVar21 + (short)(uVar18 - ((int)uVar18 >> 0x1f) >> 1)) +
           paVar35->to_a;
      file_putf(log_file,"Assigned basic stats, AC bonus: %d\n");
    }
    else if (iVar20 - 5U < 5) {
      uVar18 = data->hit_startval;
      uVar21 = Rand_div(uVar18);
      paVar35->to_h =
           paVar35->to_h +
           (int)(short)((short)uVar21 + (short)(uVar18 - ((int)uVar18 >> 0x1f) >> 1));
      uVar18 = data->dam_startval;
      uVar21 = Rand_div(uVar18);
      paVar35->to_d =
           (int)(short)((short)uVar21 + (short)(uVar18 - ((int)uVar18 >> 0x1f) >> 1)) +
           paVar35->to_d;
      file_putf(log_file,"Assigned basic stats, to_hit: %d, to_dam: %d\n",(ulong)(uint)paVar35->to_h
               );
    }
    else if (iVar20 == 0x13) {
      flag_off(flags1,5,0x14);
      flag_off(flags1,5,0x13);
      flag_on_dbg(flags1,5,0x15,"art->flags","OF_NO_FUEL");
      if ((uint)z_info->ordinary_kind_max <= poVar23->kidx) {
        paVar35->modifiers[0xd] = L'\x03';
      }
    }
    poVar23 = lookup_kind(paVar35->tval,paVar35->sval);
    wVar43 = artifact_power(*aidx,"for base item power",verbose);
    file_putf(log_file,"Base item power %d\n",(ulong)(uint)wVar43);
    if (wVar43 <= wVar33) goto LAB_00198303;
    file_putf(log_file,"Power too high!\n");
    iVar39 = iVar39 + 1;
  } while (iVar39 != 200);
  file_putf(log_file,"Warning! Couldn\'t get appropriate power level on base item.\n");
LAB_00198303:
  memset(local_328,0,0x178);
  memset(art_freq,0,0x178);
  wVar33 = paVar35->tval;
  piVar27 = data->art_probs;
  if (wVar33 == L'\x05') {
    lVar26 = 0;
    do {
      *(int *)(local_328 + (long)*(short *)((long)art_idx_bow + lVar26) * 4) =
           piVar27[*(short *)((long)art_idx_bow + lVar26)];
      lVar26 = lVar26 + 2;
    } while (lVar26 != 8);
  }
  if ((uint)(wVar33 + L'\xfffffffb') < 5) {
    lVar26 = 0;
    do {
      *(int *)(local_328 + (long)*(short *)((long)art_idx_weapon + lVar26) * 4) =
           piVar27[*(short *)((long)art_idx_weapon + lVar26)];
      lVar26 = lVar26 + 2;
    } while (lVar26 != 6);
  }
  else {
    lVar26 = 0;
    do {
      *(int *)(local_328 + (long)*(short *)((long)art_idx_nonweapon + lVar26) * 4) =
           piVar27[*(short *)((long)art_idx_nonweapon + lVar26)];
      lVar26 = lVar26 + 2;
    } while (lVar26 != 0x10);
  }
  if ((uint)(wVar33 + L'\xfffffffa') < 4) {
    lVar26 = 0;
    do {
      *(int *)(local_328 + (long)*(short *)((long)art_idx_melee + lVar26) * 4) =
           piVar27[*(short *)((long)art_idx_melee + lVar26)];
      lVar26 = lVar26 + 2;
    } while (lVar26 != 0x12);
  }
  if ((uint)(wVar33 + L'\xfffffff6') < 9) {
    local_2d8._8_4_ = piVar27[0x16];
    if (wVar33 == L'\n') {
      lVar26 = 0;
      do {
        *(int *)(local_328 + (long)*(short *)((long)art_idx_boot + lVar26) * 4) =
             piVar27[*(short *)((long)art_idx_boot + lVar26)];
        lVar26 = lVar26 + 2;
      } while (lVar26 != 0xc);
    }
    else if (wVar33 == L'\v') {
      lVar26 = 0;
      do {
        *(int *)(local_328 + (long)*(short *)((long)art_idx_glove + lVar26) * 4) =
             piVar27[*(short *)((long)art_idx_glove + lVar26)];
        lVar26 = lVar26 + 2;
      } while (lVar26 != 8);
    }
    if ((wVar33 & 0x1eU) == 0xc) {
      lVar26 = 0;
      do {
        *(int *)(local_328 + (long)*(short *)((long)art_idx_headgear + lVar26) * 4) =
             piVar27[*(short *)((long)art_idx_headgear + lVar26)];
        lVar26 = lVar26 + 2;
      } while (lVar26 != 0xc);
    }
    if (wVar33 == L'\x0e') {
      lVar26 = 0xa0;
      lVar36 = 0x9c;
    }
    else {
      if (wVar33 != L'\x0f') {
        if ((uint)(wVar33 + L'\xfffffff0') < 3) {
          lVar26 = 0;
          do {
            *(int *)(local_328 + (long)*(short *)((long)art_idx_armor + lVar26) * 4) =
                 piVar27[*(short *)((long)art_idx_armor + lVar26)];
            lVar26 = lVar26 + 2;
          } while (lVar26 != 0xe);
        }
        goto LAB_001984af;
      }
      lVar26 = 0xa8;
      lVar36 = 0xa4;
    }
    *(undefined4 *)(local_328 + lVar36) = *(undefined4 *)((long)piVar27 + lVar36);
    *(undefined4 *)(local_328 + lVar26) = *(undefined4 *)((long)piVar27 + lVar26);
  }
LAB_001984af:
  lVar26 = 0;
  do {
    *(int *)(local_328 + (long)*(short *)((long)art_idx_gen + lVar26) * 4) =
         piVar27[*(short *)((long)art_idx_gen + lVar26)];
    lVar26 = lVar26 + 2;
  } while (lVar26 != 0x46);
  uVar28 = 0xffffffffffffffff;
  lVar26 = 0;
  do {
    iVar39 = *(int *)(local_328 + lVar26 * 4);
    uVar40 = uVar28;
    do {
      art_freq[uVar40 + 1] = art_freq[uVar40 + 1] + iVar39;
      uVar40 = uVar40 + 1;
    } while (uVar40 < 0x5d);
    lVar26 = lVar26 + 1;
    uVar28 = uVar28 + 1;
  } while (lVar26 != 0x5e);
  uVar28 = 0;
  do {
    file_putf(log_file,"Cumulative frequency of ability %d is: %d\n",uVar28 & 0xffffffff,
              (ulong)(uint)art_freq[uVar28]);
    uVar28 = uVar28 + 1;
  } while (uVar28 != 0x5e);
  copy_artifact(paVar35,a_dst);
  wVar33 = paVar35->tval;
  if ((uint)(wVar33 + L'\xfffffffa') < 4) {
    uVar18 = Rand_div((uint)z_info->a_max);
    if ((int)uVar18 < data->art_probs[0x57]) {
      uVar18 = Rand_div(4);
      wVar33 = uVar18 + paVar35->dd + L'\x03';
      uVar28 = (ulong)(uint)wVar33;
      paVar35->dd = wVar33;
      pcVar24 = "Supercharging damage dice!  (Now %d dice)\n";
LAB_001985d3:
      file_putf(log_file,pcVar24,uVar28);
    }
    else {
      uVar18 = Rand_div((uint)z_info->a_max);
      if ((int)uVar18 < data->art_probs[0x5b]) {
        paVar35->modifiers[10] = L'\x02';
        pcVar24 = "Supercharging melee blows! (%+d blows)\n";
        uVar28 = 2;
        goto LAB_001985d3;
      }
    }
    wVar33 = paVar35->tval;
  }
  if (wVar33 == L'\x05') {
    uVar18 = Rand_div((uint)z_info->a_max);
    if ((int)uVar18 < data->art_probs[0x58]) {
      paVar35->modifiers[0xb] = L'\x14';
      pcVar24 = "Supercharging shots! (%+d extra shots)\n";
      uVar37 = 0x14;
    }
    else {
      uVar18 = Rand_div((uint)z_info->a_max);
      if (data->art_probs[0x59] <= (int)uVar18) goto LAB_00198661;
      paVar35->modifiers[0xc] = L'\x03';
      pcVar24 = "Supercharging might! (%+d extra might)\n";
      uVar37 = 3;
    }
    file_putf(log_file,pcVar24,uVar37);
  }
LAB_00198661:
  uVar18 = Rand_div((uint)z_info->a_max);
  if ((int)uVar18 < data->art_probs[0x5a]) {
LAB_00198685:
    uVar18 = Rand_div(6);
    paVar35->modifiers[9] = uVar18 + L'\x05';
    uVar18 = Rand_div(2);
    if (uVar18 == 0) {
      uVar18 = Rand_div(3);
      paVar35->modifiers[9] = uVar18 + paVar35->modifiers[9] + L'\x01';
    }
    uVar18 = Rand_div(6);
    if (uVar18 == 0) {
      uVar18 = Rand_div(6);
      wVar33 = uVar18 + paVar35->modifiers[9] + L'\x02';
      paVar35->modifiers[9] = wVar33;
    }
    else {
      wVar33 = paVar35->modifiers[9];
    }
    file_putf(log_file,"Supercharging speed for this item!  (New speed bonus is %d)\n",
              (ulong)(uint)wVar33);
LAB_00198727:
    wVar33 = paVar35->tval;
  }
  else {
    wVar33 = paVar35->tval;
    if (wVar33 == L'\n') {
      uVar18 = Rand_div((uint)z_info->a_max);
      if ((int)uVar18 < data->art_probs[0x1b]) goto LAB_00198685;
      goto LAB_00198727;
    }
  }
  if ((uint)(wVar33 + L'\xfffffffa') < 4) {
    uVar18 = Rand_div((uint)z_info->a_max);
    if ((int)uVar18 < data->art_probs[0x5c]) {
LAB_0019878d:
      uVar18 = Rand_div(0xb);
      paVar35->to_a = uVar18 + paVar35->to_a + L'\x14';
      uVar18 = Rand_div(2);
      if (uVar18 == 0) {
        uVar18 = Rand_div(10);
        paVar35->to_a = uVar18 + paVar35->to_a + L'\x01';
      }
      uVar18 = Rand_div(6);
      if (uVar18 == 0) {
        uVar18 = Rand_div(0x14);
        wVar33 = uVar18 + paVar35->to_a + L'\x01';
        paVar35->to_a = wVar33;
      }
      else {
        wVar33 = paVar35->to_a;
      }
      file_putf(log_file,"Supercharging AC! New AC bonus is %d\n",(ulong)(uint)wVar33);
    }
  }
  else if ((wVar33 != L'\x05') &&
          (uVar18 = Rand_div((uint)z_info->a_max), (int)uVar18 < data->art_probs[0x5d]))
  goto LAB_0019878d;
  wVar33 = paVar35->tval;
  uVar18 = Rand_div((uint)z_info->a_max);
  uVar32 = extraout_DL;
  if ((uint)(wVar33 + L'\xfffffffb') < 5) {
    if ((uint)wVar34 < 0x12d) goto LAB_001988be;
    iVar39 = data->art_probs[0x55];
  }
  else {
    if ((uint)wVar34 < 0x12d) goto LAB_001988be;
    iVar39 = data->art_probs[0x56];
  }
  if ((int)uVar18 < iVar39) {
    flag_on_dbg(flags1,5,0x1a,"art->flags","OF_AGGRAVATE");
    file_putf(log_file,"Adding aggravation\n");
    uVar32 = extraout_DL_00;
  }
LAB_001988be:
  wVar33 = artifact_power(*aidx,"result of supercharge",(_Bool)uVar32);
  wVar43 = (uint)(wVar34 * 0x17) / 0x14 + L'\x01';
  if (wVar43 < wVar33) {
    copy_artifact(a_dst,paVar35);
    file_putf(log_file,"--- Supercharge is too powerful! Rolling back.\n");
  }
  uVar38 = data->neg_power_total;
  if ((int)uVar38 < 3) {
    uVar38 = 2;
  }
  uVar18 = Rand_div(z_info->a_max / uVar38);
  bVar42 = uVar18 == 0 || wVar19 < L'\0';
  peVar2 = paVar35->el_info + 0xc;
  peVar3 = paVar35->el_info + 0xb;
  peVar4 = paVar35->el_info + 10;
  peVar5 = paVar35->el_info + 9;
  peVar6 = paVar35->el_info + 8;
  peVar7 = paVar35->el_info + 7;
  peVar8 = paVar35->el_info + 6;
  peVar9 = paVar35->el_info + 5;
  peVar10 = paVar35->el_info + 4;
  local_338 = (uint)(wVar34 * 0x13) / 0x14;
  local_3d4 = 0;
  do {
    copy_artifact(paVar35,a_dst);
    wVar19 = Rand_div(art_freq[0x5d]);
    uVar38 = 0xffffffff;
    pwVar30 = art_freq;
    do {
      uVar38 = uVar38 + 1;
      wVar33 = *pwVar30;
      pwVar30 = pwVar30 + 1;
    } while (wVar33 <= wVar19);
    file_putf(log_file,"Ability chosen was number: %d\n",(ulong)uVar38);
    poVar29 = lookup_kind(paVar35->tval,paVar35->sval);
    wVar19 = L'\x0026f020';
    switch(uVar38) {
    case 0:
    case 0xc:
      wVar19 = L'\v';
      goto LAB_0019947a;
    case 1:
      wVar19 = L'\f';
      goto LAB_0019947a;
    case 2:
    case 9:
    case 0xe:
      if ((*dest == (_Bool *)0x0) || (uVar18 = Rand_div(4), uVar18 == 0)) {
        iVar39 = 200;
        do {
          uVar18 = Rand_div(z_info->brand_max - 1);
          wVar19 = uVar18 + L'\x01';
          _Var16 = append_brand(dest,wVar19);
          pbVar15 = brands;
          if (_Var16) {
            file_putf(log_file,"Adding brand: %sx%d\n",brands[wVar19].name,
                      (ulong)(uint)brands[wVar19].multiplier);
            uVar18 = Rand_div(4);
            if (uVar18 != 0) {
              lVar26 = 2;
              peVar31 = peVar1;
              ppVar45 = projections;
              do {
                pcVar24 = *(char **)(&ppVar45->index + lVar26);
                iVar39 = strcmp(pbVar15[wVar19].name,pcVar24);
                if ((iVar39 == 0) && (peVar31->res_level < 1)) {
                  peVar31->res_level = 1;
                  file_putf(log_file,"Adding resistance to %s\n",pcVar24);
                  ppVar45 = projections;
                }
                peVar31 = peVar31 + 1;
                lVar26 = lVar26 + 0x1a;
              } while (lVar26 != 0x6a);
            }
            break;
          }
          iVar39 = iVar39 + -1;
        } while (iVar39 != 0);
      }
      break;
    case 3:
    case 10:
    case 0xf:
      iVar39 = 0;
      do {
        while( true ) {
          uVar18 = Rand_div(z_info->slay_max - 1);
          wVar19 = uVar18 + L'\x01';
          _Var16 = append_slay(&paVar35->slays,wVar19);
          psVar14 = slays;
          if (!_Var16) break;
          iVar39 = 0;
          file_putf(log_file,"Adding slay: %sx%d\n",slays[wVar19].name,
                    (ulong)(uint)slays[wVar19].multiplier);
          uVar18 = Rand_div(4);
          if ((uVar18 == 0) || (0x68 < psVar14[wVar19].power)) goto switchD_00198a6a_default;
        }
        iVar39 = iVar39 + 1;
      } while (iVar39 != 200);
      break;
    case 4:
    case 6:
      add_to_hit(paVar35,data->hit_increment * 2,L'\x0026f020');
      break;
    case 5:
    case 7:
      iVar39 = data->dam_increment;
      goto LAB_00198d0c;
    case 8:
    case 0x20:
      add_to_hit(paVar35,data->hit_increment * 2,L'\x0026f020');
      iVar39 = data->dam_increment;
      wVar19 = extraout_EDX;
LAB_00198d0c:
      add_to_dam(paVar35,iVar39 * 2,wVar19);
      break;
    case 0xb:
    case 0x11:
      wVar19 = L'\n';
      goto LAB_0019947a;
    case 0xd:
      wVar19 = L'\x12';
      goto LAB_001993ac;
    case 0x10:
    case 0x24:
    case 0x3d:
      wVar19 = L'\x0e';
      goto LAB_001993ac;
    case 0x12:
    case 0x17:
    case 0x1d:
    case 0x21:
    case 0x27:
    case 0x29:
    case 0x2b:
    case 0x4e:
      iVar39 = data->ac_increment;
      if (paVar35->to_a < L'%') {
        if (L'\x1a' < paVar35->to_h) {
          uVar18 = 2;
          goto LAB_00198a93;
        }
      }
      else {
        uVar18 = 6;
LAB_00198a93:
        uVar18 = Rand_div(uVar18);
        if (uVar18 != 0) {
          uVar28 = (ulong)(uint)paVar35->to_a;
          pcVar24 = "Failed to add to-AC, value %d is too high\n";
          goto LAB_00199387;
        }
      }
      uVar18 = Rand_div(iVar39 * 2);
      wVar19 = (int)(short)((short)uVar18 + 1) + paVar35->to_a;
      uVar28 = (ulong)(uint)wVar19;
      paVar35->to_a = wVar19;
      pcVar24 = "Adding ability: AC bonus (new bonus is %+d)\n";
      goto LAB_00199387;
    case 0x13:
      uVar18 = Rand_div(2);
      wVar19 = (uVar18 + 1 & 0xff) + paVar35->dd;
      uVar28 = (ulong)(uint)wVar19;
      paVar35->dd = wVar19;
      pcVar24 = "Adding ability: extra damage dice (now %d dice)\n";
      goto LAB_00199387;
    case 0x14:
    case 0x16:
      wVar19 = (paVar35->weight * 9) / 10;
      uVar28 = (ulong)(uint)wVar19;
      paVar35->weight = wVar19;
      pcVar24 = "Adding ability: lower weight (new weight is %d)\n";
LAB_00199387:
      file_putf(log_file,pcVar24,uVar28);
      break;
    case 0x15:
    case 0x4f:
      wVar19 = L'\b';
      goto LAB_0019947a;
    case 0x18:
    case 0x3b:
      wVar19 = L'\v';
      goto LAB_001993ac;
    case 0x19:
    case 0x2a:
    case 0x2c:
    case 0x34:
      wVar19 = L'\x05';
      goto LAB_0019947a;
    case 0x1a:
    case 0x54:
      wVar19 = L'$';
      goto LAB_001993ac;
    case 0x1b:
    case 0x37:
      wVar19 = L'\t';
      goto LAB_0019947a;
    case 0x1c:
    case 0x53:
      wVar19 = L'\x0f';
      goto LAB_0019947a;
    case 0x1e:
    case 0x39:
      wVar19 = L'\x0f';
      goto LAB_001993ac;
    case 0x1f:
      wVar19 = L'\x03';
      goto LAB_0019947a;
    case 0x22:
    case 0x46:
      wVar19 = L'\a';
      goto LAB_001993ac;
    case 0x23:
    case 0x3e:
      wVar19 = L'\r';
      goto LAB_001993ac;
    case 0x25:
      wVar19 = L'\x02';
      goto LAB_0019947a;
    case 0x26:
      wVar19 = L'\x01';
      goto LAB_0019947a;
    case 0x28:
    case 0x2f:
    case 0x41:
      lVar26 = 0;
      lVar36 = 0;
      lVar47 = 0;
      do {
        uVar38 = (uint)paVar35->el_info[lVar26] & 0xffff |
                 (uint)(ushort)paVar35->el_info[lVar26 + 1].res_level << 0x10;
        auVar48._4_4_ = uVar38;
        auVar48._0_4_ = uVar38;
        auVar48._8_4_ = uVar38;
        auVar48._12_4_ = uVar38;
        auVar48 = pshufhw(auVar48,auVar48,0x55);
        auVar49._0_2_ = -(ushort)(0 < auVar48._0_2_);
        auVar49._2_2_ = -(ushort)(0 < auVar48._2_2_);
        auVar49._4_2_ = -(ushort)(0 < auVar48._4_2_);
        auVar49._6_2_ = -(ushort)(0 < auVar48._6_2_);
        auVar49._8_2_ = -(ushort)(0 < auVar48._8_2_);
        auVar49._10_2_ = -(ushort)(0 < auVar48._10_2_);
        auVar49._12_2_ = -(ushort)(0 < auVar48._12_2_);
        auVar49._14_2_ = -(ushort)(0 < auVar48._14_2_);
        lVar36 = lVar36 + SUB168(~auVar49 & _DAT_0026bf70,0);
        lVar47 = lVar47 + SUB168(~auVar49 & _DAT_0026bf70,8);
        lVar26 = lVar26 + 2;
      } while (lVar26 != 4);
      if (lVar47 + lVar36 != 0) {
        uVar18 = Rand_div((uint32_t)(lVar47 + lVar36));
        lVar26 = 2;
        lVar36 = 0;
        peVar31 = peVar1;
        do {
          if (peVar31->res_level < 1) {
            if (lVar36 == (int)uVar18) {
              peVar31->res_level = 1;
              pcVar24 = *(char **)(&projections->index + lVar26);
              goto LAB_00199920;
            }
            lVar36 = lVar36 + 1;
          }
          peVar31 = peVar31 + 1;
          lVar26 = lVar26 + 0x1a;
        } while (lVar26 != 0x6a);
      }
      break;
    case 0x2d:
    case 0x3a:
      wVar19 = L'\x10';
      goto LAB_001993ac;
    case 0x2e:
      wVar19 = L'\x04';
      goto LAB_0019947a;
    case 0x30:
      if (peVar1->res_level < 1) {
        peVar1->res_level = 1;
        file_putf(log_file,"Adding resistance to %s\n",projections->name);
      }
      if (paVar35->el_info[1].res_level < 1) {
        paVar35->el_info[1].res_level = 1;
        file_putf(log_file,"Adding resistance to %s\n",projections[1].name);
      }
      if (paVar35->el_info[2].res_level < 1) {
        paVar35->el_info[2].res_level = 1;
        file_putf(log_file,"Adding resistance to %s\n",projections[2].name);
      }
      if (paVar35->el_info[3].res_level < 1) {
        paVar35->el_info[3].res_level = 1;
        pcVar24 = projections[3].name;
LAB_00199920:
        pcVar25 = "Adding resistance to %s\n";
        goto LAB_00199927;
      }
      break;
    case 0x31:
      lVar26 = 0;
      uVar18 = 0;
      do {
        uVar18 = uVar18 + data->art_probs[*(short *)((long)art_idx_high_resist + lVar26)];
        lVar26 = lVar26 + 2;
      } while (lVar26 != 0x1a);
      uVar38 = 0;
      do {
        uVar21 = Rand_div(uVar18);
        uVar18 = data->art_probs[0x42];
        if ((int)uVar21 < (int)uVar18) {
          if (peVar10->res_level < 1) {
            lVar26 = 0x1a8;
            peVar31 = peVar10;
            goto LAB_00199906;
          }
          goto switchD_0019926d_default;
        }
        uVar28 = 0xffffffffffffffff;
        piVar41 = art_idx_high_resist;
        do {
          uVar28 = uVar28 + 1;
          uVar18 = uVar18 + data->art_probs[*piVar41];
          if (0xb < uVar28) break;
          piVar41 = piVar41 + 1;
        } while ((int)uVar18 <= (int)uVar21);
        switch(uVar28) {
        case 0:
          wVar19 = L'\x06';
          goto LAB_001992b0;
        case 1:
          if (peVar9->res_level < 1) {
            lVar26 = 0x210;
            peVar31 = peVar9;
LAB_00199906:
            peVar31->res_level = 1;
            pcVar24 = *(char **)((long)&projections->index + lVar26);
            goto LAB_00199920;
          }
          break;
        case 2:
          if (peVar8->res_level < 1) {
            lVar26 = 0x278;
            peVar31 = peVar8;
            goto LAB_00199906;
          }
          break;
        case 3:
          wVar19 = L'\a';
          goto LAB_001992b0;
        case 4:
          wVar19 = L'\b';
          goto LAB_001992b0;
        case 5:
          if (peVar7->res_level < 1) {
            lVar26 = 0x2e0;
            peVar31 = peVar7;
            goto LAB_00199906;
          }
          break;
        case 6:
          if (peVar6->res_level < 1) {
            lVar26 = 0x348;
            peVar31 = peVar6;
            goto LAB_00199906;
          }
          break;
        case 7:
          if (peVar5->res_level < 1) {
            lVar26 = 0x3b0;
            peVar31 = peVar5;
            goto LAB_00199906;
          }
          break;
        case 8:
          if (peVar4->res_level < 1) {
            lVar26 = 0x418;
            peVar31 = peVar4;
            goto LAB_00199906;
          }
          break;
        case 9:
          if (peVar3->res_level < 1) {
            lVar26 = 0x480;
            peVar31 = peVar3;
            goto LAB_00199906;
          }
          break;
        case 10:
          if (peVar2->res_level < 1) {
            lVar26 = 0x4e8;
            peVar31 = peVar2;
            goto LAB_00199906;
          }
          break;
        case 0xb:
          wVar19 = L'\t';
LAB_001992b0:
          _Var16 = add_flag(paVar35,wVar19);
          goto LAB_0019921a;
        }
switchD_0019926d_default:
        _Var16 = false;
LAB_0019921a:
      } while ((_Var16 == false) && (bVar11 = uVar38 < 199, uVar38 = uVar38 + 1, bVar11));
      break;
    case 0x32:
      wVar19 = Rand_div(5);
      goto LAB_0019947a;
    case 0x33:
      _Var16 = flags_test_all(flags1,5,1,2,3,4,5,0);
      while (_Var16 == false) {
switchD_00199040_default:
        uVar18 = Rand_div(5);
        switch(uVar18) {
        case 0:
          wVar19 = L'\x01';
          break;
        case 1:
          wVar19 = L'\x02';
          break;
        case 2:
          wVar19 = L'\x03';
          break;
        case 3:
          wVar19 = L'\x04';
          break;
        case 4:
          wVar19 = L'\x05';
          break;
        default:
          goto switchD_00199040_default;
        }
        _Var16 = add_flag(paVar35,wVar19);
      }
      break;
    case 0x35:
      wVar19 = L'\x06';
      goto LAB_0019947a;
    case 0x36:
      wVar19 = L'\a';
      goto LAB_0019947a;
    case 0x38:
      uVar18 = Rand_div(4);
      peVar1[(int)uVar18].res_level = 3;
      pcVar24 = projections[(int)uVar18].name;
      pcVar25 = "Adding immunity to %s\n";
LAB_00199927:
      file_putf(log_file,pcVar25,pcVar24);
      break;
    case 0x3c:
      if (paVar35->tval != L'\x13') {
        paVar35->modifiers[0xd] = L'\x01';
      }
      break;
    case 0x3f:
      wVar19 = L'\n';
      goto LAB_001993ac;
    case 0x40:
      wVar19 = L'\f';
      goto LAB_001993ac;
    case 0x42:
      if (peVar10->res_level < 1) {
        peVar10->res_level = 1;
        pcVar24 = projections[4].name;
        goto LAB_00199920;
      }
      break;
    case 0x43:
      wVar19 = L'\x06';
      goto LAB_001993ac;
    case 0x44:
      if (peVar9->res_level < 1) {
        peVar9->res_level = 1;
        pcVar24 = projections[5].name;
        goto LAB_00199920;
      }
      break;
    case 0x45:
      if (peVar8->res_level < 1) {
        peVar8->res_level = 1;
        pcVar24 = projections[6].name;
        goto LAB_00199920;
      }
      break;
    case 0x47:
      wVar19 = L'\b';
      goto LAB_001993ac;
    case 0x48:
      if (peVar7->res_level < 1) {
        peVar7->res_level = 1;
        pcVar24 = projections[7].name;
        goto LAB_00199920;
      }
      break;
    case 0x49:
      if (peVar6->res_level < 1) {
        peVar6->res_level = 1;
        pcVar24 = projections[8].name;
        goto LAB_00199920;
      }
      break;
    case 0x4a:
      if (peVar5->res_level < 1) {
        peVar5->res_level = 1;
        pcVar24 = projections[9].name;
        goto LAB_00199920;
      }
      break;
    case 0x4b:
      if (peVar4->res_level < 1) {
        peVar4->res_level = 1;
        pcVar24 = projections[10].name;
        goto LAB_00199920;
      }
      break;
    case 0x4c:
      if (peVar3->res_level < 1) {
        peVar3->res_level = 1;
        pcVar24 = projections[0xb].name;
        goto LAB_00199920;
      }
      break;
    case 0x4d:
      if (peVar2->res_level < 1) {
        peVar2->res_level = 1;
        pcVar24 = projections[0xc].name;
        goto LAB_00199920;
      }
      break;
    case 0x50:
      if ((paVar35->activation == (activation *)0x0) && (poVar29->activation == (activation *)0x0))
      {
        add_activation(paVar35,wVar34,data->max_power);
      }
      break;
    case 0x51:
      wVar19 = L'\t';
LAB_001993ac:
      add_flag(paVar35,wVar19);
      break;
    case 0x52:
      wVar19 = L'\x0e';
LAB_0019947a:
      add_mod(paVar35,wVar19);
      break;
    case 0x55:
    case 0x56:
      if (300 < (uint)wVar34) {
        wVar19 = L'\x1a';
        goto LAB_001993ac;
      }
    }
switchD_00198a6a_default:
    remove_contradictory(paVar35);
    if ((paVar35->modifiers[2] != L'\0') && ((paVar35->tval & 0xfffffffeU) == 8)) {
      add_flag(paVar35,L'\x12');
    }
    remove_contradictory(paVar35);
    wVar19 = artifact_power(*aidx,"artifact attempt",verbose_00);
    if (wVar19 < L'\0') {
      wVar19 = -wVar19;
      goto LAB_001999b2;
    }
    if (bVar42) {
      uVar18 = Rand_div(2);
      file_putf(log_file,"Make it bad:\n");
      file_putf(log_file,"   ");
      uVar21 = Rand_div(7);
      if (uVar21 == 0) {
        flag_on_dbg(flags1,5,0x1a,"art->flags","OF_AGGRAVATE");
        file_putf(log_file," aggravate,");
      }
      uVar21 = Rand_div(4);
      if (uVar21 == 0) {
        flag_on_dbg(flags1,5,0x1b,"art->flags","OF_DRAIN_EXP");
        file_putf(log_file," drain xp,");
      }
      uVar21 = Rand_div(7);
      if (uVar21 == 0) {
        flag_on_dbg(flags1,5,0x19,"art->flags","OF_NO_TELEPORT");
        file_putf(log_file," no tele,");
      }
      uVar38 = 0;
      lVar26 = 0x14;
      uVar44 = 0;
      do {
        if (0 < *(int *)(paVar35->flags + lVar26 * 4 + -0x48)) {
          uVar44 = uVar44 + 1;
          uVar21 = Rand_div(2);
          if ((lVar26 != 0x20) && (uVar21 == 0)) {
            *(int *)(paVar35->flags + lVar26 * 4 + -0x48) =
                 -*(int *)(paVar35->flags + lVar26 * 4 + -0x48);
            uVar38 = uVar38 + 1;
          }
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != 0x24);
      file_putf(log_file," flip %d of %d modifiers,",(ulong)uVar38,(ulong)uVar44);
      if ((L'\0' < paVar35->to_a) && (uVar21 = Rand_div(2), uVar21 == 0)) {
        paVar35->to_a = -paVar35->to_a;
        file_putf(log_file," flip ac,");
      }
      if ((L'\0' < paVar35->to_h) && (uVar21 = Rand_div(2), uVar21 == 0)) {
        paVar35->to_h = -paVar35->to_h;
        file_putf(log_file," flip to-hit,");
      }
      if ((L'\0' < paVar35->to_d) && (uVar21 = Rand_div(4), uVar21 == 0)) {
        paVar35->to_d = -paVar35->to_d;
        file_putf(log_file," flip to-dam,");
      }
      uVar38 = 0;
      for (iVar39 = uVar18 + 1; iVar39 != 0; iVar39 = iVar39 + -1) {
        _Var16 = flag_has_dbg(flags1,5,0x12,"art->flags","OF_BLESSED");
        if (!_Var16) {
          iVar20 = -5;
          do {
            uVar21 = Rand_div(z_info->curse_max - 1);
            uVar22 = Rand_div(9);
            iVar17 = m_bonus(9,local_3ac);
            if (curses[uVar21 + L'\x01'].poss[paVar35->tval] == true) {
              _Var16 = append_artifact_curse
                                 (paVar35,uVar21 + L'\x01',uVar22 + iVar17 * 10 + L'\x01');
              uVar38 = uVar38 + _Var16;
              break;
            }
            iVar20 = iVar20 + 1;
          } while (iVar20 != 0);
        }
      }
      file_putf(log_file," %d of %d curses applied\n",(ulong)uVar38,uVar18 + 1);
      uVar18 = Rand_div(3);
      bVar42 = uVar18 != 0;
    }
    else {
      bVar42 = false;
    }
    if (wVar43 < wVar19) {
      copy_artifact(a_dst,paVar35);
      file_putf(log_file,"--- Too powerful!  Rolling back.\n");
    }
    else if (local_338 <= wVar19) goto LAB_001999b2;
    local_3d4 = local_3d4 + 1;
  } while (local_3d4 != 200);
  file_putf(log_file,"Warning!  Couldn\'t get appropriate power level on artifact.\n");
  local_3d4 = 200;
LAB_001999b2:
  mem_free(a_dst->slays);
  mem_free(a_dst->brands);
  mem_free(a_dst->curses);
  mem_free(a_dst);
  wVar33 = L'\x14';
  if (poVar23->alloc_prob != L'\0') {
    wVar33 = poVar23->alloc_prob;
  }
  wVar43 = (wchar_t)((long)(4000000 / (ulong)(uint)(wVar19 * wVar19)) / (long)wVar33);
  wVar33 = L'c';
  if (wVar43 < L'c') {
    wVar33 = wVar43;
  }
  wVar43 = L'\x01';
  if (L'\x01' < wVar33) {
    wVar43 = wVar33;
  }
  paVar35->alloc_prob = wVar43;
  wVar33 = L'\x7f';
  if (wVar19 < L'Ô') {
    wVar33 = (wVar19 * 3) / 5;
  }
  paVar35->alloc_max = wVar33;
  wVar43 = (wVar19 * 100 + 10000) / data->max_power;
  wVar33 = L'd';
  if (wVar43 < L'd') {
    wVar33 = wVar43;
  }
  paVar35->alloc_min = wVar33;
  uVar21 = (uint)wVar34 / 0x14 + 5;
  uVar18 = Rand_div(uVar21);
  if (uVar18 == 0) {
    uVar18 = Rand_div(0x14);
    wVar34 = paVar35->alloc_min;
    wVar43 = uVar18 + paVar35->alloc_prob + L'\x01';
    wVar33 = L'c';
    if (wVar43 < L'c') {
      wVar33 = wVar43;
    }
    paVar35->alloc_prob = wVar33;
  }
  else {
    uVar18 = Rand_div(uVar21);
    wVar34 = paVar35->alloc_min;
    if (uVar18 == 0) {
      wVar33 = wVar34 / 2;
      bVar42 = L'\x01' < wVar34;
      wVar34 = L'\x01';
      if (bVar42) {
        wVar34 = wVar33;
      }
      paVar35->alloc_min = wVar34;
    }
  }
  wVar33 = L'\x7f';
  if (wVar34 < L'@') {
    wVar33 = wVar34 * 2;
  }
  if (wVar33 < paVar35->alloc_max) {
    wVar33 = paVar35->alloc_max;
  }
  paVar35->alloc_max = wVar33;
  if (((paVar35->activation == (activation *)0x0) && (poVar23->activation == (activation *)0x0)) &&
     (poVar23->effect == (effect *)0x0)) {
    paVar35->level = wVar34;
  }
  file_putf(log_file,"New depths are min %d, max %d\n");
  file_putf(log_file,"Power-based alloc_prob is %d\n",(ulong)(uint)paVar35->alloc_prob);
  file_putf(log_file,"<<<<<<<<<<<<<<<<<<<<<<<<<< ARTIFACT COMPLETED\n");
  file_putf(log_file,"Number of tries for artifact %d was: %d\n",(ulong)(uint)*aidx,(ulong)local_3d4
           );
  paVar35 = a_info;
  iVar39 = *aidx;
  pcVar24 = "Random ";
  pcVar25 = local_328;
  for (lVar26 = 0x10; lVar26 != 0; lVar26 = lVar26 + -1) {
    *(undefined8 *)pcVar25 = *(undefined8 *)pcVar24;
    pcVar24 = pcVar24 + ((ulong)bVar46 * -2 + 1) * 8;
    pcVar25 = pcVar25 + (ulong)bVar46 * -0x10 + 8;
  }
  pcVar24 = tval_find_name(a_info[iVar39].tval);
  my_strcat(local_328,pcVar24,0x80);
  pcVar24 = format(" of power %d",(ulong)(uint)wVar19);
  my_strcat(local_328,pcVar24,0x80);
  string_free(paVar35[iVar39].text);
  pcVar24 = string_make(local_328);
  paVar35[iVar39].text = pcVar24;
  return;
}

Assistant:

static void design_artifact(struct artifact_set_data *data, int tv, int *aidx)
{
	struct artifact *art = &a_info[*aidx];
	struct object_kind *kind = lookup_kind(art->tval, art->sval);
	int art_freq[ART_IDX_TOTAL];
	int art_level = art->level;
	int tries;
	int alloc_new;
	int ap = 0;
	bool hurt_me = false;

	/* Set tval if necessary */
	int tval = (tv == TV_NULL) ? get_base_item_tval(data) : tv;

	/* Structure to hold the old artifact */
	struct artifact *a_old = mem_zalloc(sizeof *a_old);

	/* Choose a power for the artifact */
	int power = Rand_sample(data->avg_tv_power[tval],
							data->max_tv_power[tval],
							data->min_tv_power[tval],
							20, 20);

	/* Choose a name */
	char *new_name = artifact_gen_name(art, name_sections);

	/* Skip fixed artifacts */
	while (strstr(art->name, "The One Ring") ||
		kf_has(kind->kind_flags, KF_QUEST_ART)) {
		(*aidx)++;
		if ((*aidx) >= z_info->a_max) {
			string_free(new_name);
			mem_free(a_old);
			return;
		}
		art = &a_info[*aidx];
		art_level = art->level;
	}

	/* Apply the new name */
	string_free(art->name);
	art->name = new_name;

	file_putf(log_file, ">>>>>>>>>>>>>>>>>>>>>>>>>> CREATING NEW ARTIFACT\n");
	file_putf(log_file, "Artifact %d: power = %d\n", *aidx, power);

	/* Flip the sign on power if it's negative (unlikely) and damage */
	if (power < 0) {
		hurt_me = true;
		power = -power;
	}

	/* Choose a base item typen not too powerful, so we'll have to add to it. */
	for (tries = 0; tries < MAX_TRIES; tries++) {
		int base_power = 0;

		/* Get the new item kind and do basic prep on it */
		if (tval == TV_NULL) {
			tval = get_base_item_tval(data);
		}
		kind = get_base_item(data, tval);
		artifact_prep(art, kind, data);

		/* Get the kind again in case it's changed */
		kind = lookup_kind(art->tval, art->sval);

		base_power = artifact_power(*aidx, "for base item power", true);
		file_putf(log_file, "Base item power %d\n", base_power);

		/* New base item power too close to target artifact power */
		if ((base_power > (power * 6) / 10 + 1) && (power - base_power < 20)) {
			file_putf(log_file, "Power too high!\n");
			continue;
		}

		/* Acceptable */
		break;
	};

	/* Failed to get a good base item */
	if (tries >= MAX_TRIES)
		file_putf(log_file, "Warning! Couldn't get appropriate power level on base item.\n");

	/* Generate the cumulative frequency table for this base item type */
	build_freq_table(art, art_freq, data);

	/* Copy artifact info temporarily. */
	copy_artifact(art, a_old);

	/* Give this artifact a shot at being supercharged */
	try_supercharge(art, power, data);
	ap = artifact_power(*aidx, "result of supercharge", true);
	if (ap > (power * 23) / 20 + 1)	{
		/* Too powerful -- put it back */
		copy_artifact(a_old, art);
		file_putf(log_file, "--- Supercharge is too powerful! Rolling back.\n");
	}

	/* Give this artifact a chance to be cursed - note it retains its power */
	if (one_in_(z_info->a_max / MAX(2, data->neg_power_total))) {
		hurt_me = true;
	}

	/* Do the actual artifact design */
	for (tries = 0; tries < MAX_TRIES; tries++) {
		/* Copy artifact info temporarily. */
		copy_artifact(art, a_old);

		/* Add an ability */
		add_ability(art, power, art_freq, data);
		remove_contradictory(art);

		/* Check the power, handle negative power */
		ap = artifact_power(*aidx, "artifact attempt", true);
		if (ap < 0) {
			ap = -ap;
			break;
		}

		/* Curse the designated artifacts */
		if (hurt_me) {
			make_bad(art, art_level);
			if (one_in_(3)) {
				hurt_me = false;
			}
		}

		/* Check power */
		if (ap > (power * 23) / 20 + 1) {
			/* Too powerful -- put it back */
			copy_artifact(a_old, art);
			file_putf(log_file, "--- Too powerful!  Rolling back.\n");
			continue;
		} else if (ap >= (power * 19) / 20) {
			/* Just right */
			break;
		}
	}

	/* Couldn't generate an artifact with the number of permitted iterations */
	if (tries >= MAX_TRIES)
		file_putf(log_file, "Warning!  Couldn't get appropriate power level on artifact.\n");

	/* Cleanup a_old */
	mem_free(a_old->slays);
	mem_free(a_old->brands);
	mem_free(a_old->curses);
	mem_free(a_old);

	/* Set rarity based on power */
	alloc_new = 4000000 / (ap * ap);
	alloc_new /= (kind->alloc_prob ? kind->alloc_prob : 20);
	if (alloc_new > 99) alloc_new = 99;
	if (alloc_new < 1) alloc_new = 1;
	art->alloc_prob = alloc_new;


	/* Set depth according to power */
	art->alloc_max = MIN(127, (ap * 3) / 5);
	art->alloc_min = MIN(100, ((ap + 100) * 100 / data->max_power));

	/* Have a chance to be less rare or deep, more likely the less power */
	if (one_in_(5 + (power / 20))) {
		art->alloc_prob += randint1(20);
		if (art->alloc_prob > 99) art->alloc_prob = 99;
	} else if (one_in_(5 + (power / 20))) {
		art->alloc_min /= 2;
		if (art->alloc_min < 1) art->alloc_min = 1;
	}

	/* Sanity check */
	art->alloc_max = MAX(art->alloc_max, MIN(art->alloc_min * 2, 127));

	/*
	 * If there is no activation or effect from the kind, level currently
	 * does nothing.  Set it to alloc_min in case changes elsewhere start
	 * using level for the artifact.
	 */
	if (!art->activation && !kind->activation && !kind->effect) {
		art->level = art->alloc_min;
	}

	file_putf(log_file, "New depths are min %d, max %d\n", art->alloc_min,
			  art->alloc_max);
	file_putf(log_file, "Power-based alloc_prob is %d\n", art->alloc_prob);

	/* Success */
	file_putf(log_file, "<<<<<<<<<<<<<<<<<<<<<<<<<< ARTIFACT COMPLETED\n");
	file_putf(log_file, "Number of tries for artifact %d was: %d\n", *aidx,
			  tries);

	/* Describe it */
	describe_artifact(*aidx, ap);
}